

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less::operator()
          (void *this,char (*t) [5],
          reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *u)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  difference_type __diff;
  ulong uVar4;
  
  sVar3 = strlen(*t);
  uVar1 = u->_M_data->_M_string_length;
  uVar4 = uVar1;
  if (sVar3 < uVar1) {
    uVar4 = sVar3;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = memcmp(t,(u->_M_data->_M_dataplus)._M_p,uVar4);
    uVar4 = (ulong)uVar2;
  }
  if ((int)uVar4 == 0) {
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(sVar3 - uVar1)) {
      uVar4 = sVar3 - uVar1;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0;
    }
  }
  return (bool)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

bool operator()(const T& t, const U& u) const {
      return ImplicitConvert(t) < ImplicitConvert(u);
    }